

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessagePayload_payloadIsPresent_Test::
~CoapTest_CoapMessagePayload_payloadIsPresent_Test
          (CoapTest_CoapMessagePayload_payloadIsPresent_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CoapTest, CoapMessagePayload_payloadIsPresent)
{
    ByteArray buffer{0x40, 0x00, 0x00, 0x00, 0xFF, 0xfa, 0xce};
    Error     error;
    auto      message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);
    EXPECT_EQ(message->GetPayload(), (ByteArray{0xfa, 0xce}));
}